

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O3

void mpz_gcd(__mpz_struct *g,__mpz_struct *u,__mpz_struct *v)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined8 uVar4;
  mp_limb_t *pmVar5;
  int iVar6;
  mp_bitcnt_t mVar7;
  mp_bitcnt_t bits;
  ulong *puVar8;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  __mpz_struct *x;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  __mpz_struct local_48;
  __mpz_struct local_38;
  
  x = v;
  if ((u->_mp_size == 0) || (x = u, v->_mp_size == 0)) {
    mpz_set(g,x);
    iVar6 = g->_mp_size;
    iVar10 = -iVar6;
    if (0 < iVar6) {
      iVar10 = iVar6;
    }
    g->_mp_size = iVar10;
  }
  else {
    local_38._mp_alloc = 0;
    local_38._mp_size = 0;
    local_38._mp_d = &mpz_init::dummy_limb;
    local_48._mp_alloc = 0;
    local_48._mp_size = 0;
    local_48._mp_d = &mpz_init::dummy_limb;
    mpz_set(&local_38,u);
    iVar6 = -local_38._mp_size;
    if (0 < local_38._mp_size) {
      iVar6 = local_38._mp_size;
    }
    local_38._mp_size = iVar6;
    mVar7 = mpz_make_odd(&local_38);
    mpz_set(&local_48,v);
    iVar6 = -local_48._mp_size;
    if (0 < local_48._mp_size) {
      iVar6 = local_48._mp_size;
    }
    local_48._mp_size = iVar6;
    bits = mpz_make_odd(&local_48);
    pmVar5 = local_38._mp_d;
    if (mVar7 < bits) {
      bits = mVar7;
    }
    bVar3 = local_38._mp_size < local_48._mp_size;
    if (bVar3) {
      local_38._mp_d = local_48._mp_d;
      local_48._mp_d = pmVar5;
      uVar4._0_4_ = local_48._mp_alloc;
      uVar4._4_4_ = local_48._mp_size;
      local_48._mp_alloc = local_38._mp_alloc;
      local_48._mp_size = local_38._mp_size;
      local_38._0_8_ = uVar4;
    }
    mpz_div_qr((__mpz_struct *)0x0,&local_38,&local_38,&local_48,GMP_DIV_TRUNC);
    if (local_38._mp_size == 0) {
      puVar8 = g->_mp_d;
      g->_mp_d = local_48._mp_d;
      uVar2._0_4_ = g->_mp_alloc;
      uVar2._4_4_ = g->_mp_size;
      g->_mp_alloc = local_48._mp_alloc;
      g->_mp_size = local_48._mp_size;
      local_48._0_8_ = uVar2;
      local_48._mp_d = puVar8;
    }
    else {
      mpz_make_odd(&local_38);
      iVar6 = mpz_cmp(&local_38,&local_48);
      if (iVar6 != 0) {
LAB_005d0633:
        pmVar5 = local_38._mp_d;
        uVar4 = local_38._0_8_;
        if (iVar6 < 0) {
          local_38._mp_d = local_48._mp_d;
          local_48._mp_d = pmVar5;
          iVar6 = local_38._mp_size;
          local_38._mp_alloc = local_48._mp_alloc;
          local_38._mp_size = local_48._mp_size;
          uVar2 = local_38._0_8_;
          local_38._mp_alloc = (int)uVar4;
          local_38._mp_size = SUB84(uVar4,4);
          local_48._mp_alloc = local_38._mp_alloc;
          local_48._mp_size = local_38._mp_size;
          local_38._0_8_ = uVar2;
        }
        else {
          iVar6 = local_48._mp_size;
        }
        if (iVar6 != 1) goto code_r0x005d0672;
        mpz_div_qr((__mpz_struct *)0x0,&local_38,&local_38,&local_48,GMP_DIV_TRUNC);
        if (g->_mp_alloc < 1) {
          puVar8 = mpz_realloc(g,1);
        }
        else {
          puVar8 = g->_mp_d;
        }
        uVar12 = *local_38._mp_d;
        uVar11 = *local_48._mp_d;
        uVar13 = uVar11;
        if ((uVar12 != 0) && (uVar13 = uVar12, uVar11 != 0)) {
          uVar13 = -(uVar11 | uVar12) & (uVar11 | uVar12);
          iVar6 = 0;
          if (uVar13 >> 0x38 == 0) {
            iVar6 = 0;
            uVar14 = uVar13;
            do {
              uVar13 = uVar14 << 8;
              iVar6 = iVar6 + 8;
              uVar15 = uVar14 >> 0x30;
              uVar14 = uVar13;
            } while (uVar15 == 0);
          }
          for (; -1 < (long)uVar13; uVar13 = uVar13 * 2) {
            iVar6 = iVar6 + 1;
          }
          bVar9 = (byte)(0x3fU - iVar6);
          uVar15 = uVar12 >> (bVar9 & 0x3f);
          uVar11 = uVar11 >> (bVar9 & 0x3f);
          uVar14 = uVar11;
          if ((uVar12 >> ((ulong)(0x3fU - iVar6) & 0x3f) & 1) == 0) {
            uVar14 = uVar15;
          }
          do {
            uVar13 = uVar14;
            uVar14 = uVar13 >> 1;
          } while ((uVar13 & 1) == 0);
          if ((uVar15 & 1) != 0) {
            uVar11 = uVar15;
          }
          if (uVar11 != uVar13) {
            do {
              uVar12 = uVar11 - uVar13;
              if (uVar11 < uVar13 || uVar11 - uVar13 == 0) {
                uVar12 = uVar13 - uVar11;
                do {
                  uVar13 = uVar12 >> 1;
                  uVar14 = uVar12 & 2;
                  uVar12 = uVar13;
                } while (uVar14 == 0);
              }
              else {
                do {
                  uVar11 = uVar12 >> 1;
                  uVar14 = uVar12 & 2;
                  uVar12 = uVar11;
                } while (uVar14 == 0);
              }
            } while (uVar11 != uVar13);
          }
          uVar13 = uVar13 << (bVar9 & 0x3f);
        }
        *puVar8 = uVar13;
        g->_mp_size = (uint)(uVar13 != 0);
        goto LAB_005d080e;
      }
LAB_005d0697:
      puVar8 = g->_mp_d;
      g->_mp_d = local_38._mp_d;
      uVar1._0_4_ = g->_mp_alloc;
      uVar1._4_4_ = g->_mp_size;
      g->_mp_alloc = local_38._mp_alloc;
      g->_mp_size = local_38._mp_size;
      local_38._0_8_ = uVar1;
      local_38._mp_d = puVar8;
    }
LAB_005d080e:
    if ((long)local_38._mp_alloc != 0) {
      (*gmp_free_func)(local_38._mp_d,(long)local_38._mp_alloc << 3);
    }
    if ((long)local_48._mp_alloc != 0) {
      (*gmp_free_func)(local_48._mp_d,(long)local_48._mp_alloc << 3);
    }
    mpz_mul_2exp(g,g,bits);
  }
  return;
code_r0x005d0672:
  mpz_sub(&local_38,&local_38,&local_48);
  mpz_make_odd(&local_38);
  iVar6 = mpz_cmp(&local_38,&local_48);
  if (iVar6 == 0) goto LAB_005d0697;
  goto LAB_005d0633;
}

Assistant:

void
mpz_gcd (mpz_t g, const mpz_t u, const mpz_t v)
{
  mpz_t tu, tv;
  mp_bitcnt_t uz, vz, gz;

  if (u->_mp_size == 0)
    {
      mpz_abs (g, v);
      return;
    }
  if (v->_mp_size == 0)
    {
      mpz_abs (g, u);
      return;
    }

  mpz_init (tu);
  mpz_init (tv);

  mpz_abs (tu, u);
  uz = mpz_make_odd (tu);
  mpz_abs (tv, v);
  vz = mpz_make_odd (tv);
  gz = GMP_MIN (uz, vz);

  if (tu->_mp_size < tv->_mp_size)
    mpz_swap (tu, tv);

  mpz_tdiv_r (tu, tu, tv);
  if (tu->_mp_size == 0)
    {
      mpz_swap (g, tv);
    }
  else
    for (;;)
      {
	int c;

	mpz_make_odd (tu);
	c = mpz_cmp (tu, tv);
	if (c == 0)
	  {
	    mpz_swap (g, tu);
	    break;
	  }
	if (c < 0)
	  mpz_swap (tu, tv);

	if (tv->_mp_size == 1)
	  {
	    mp_limb_t *gp;

	    mpz_tdiv_r (tu, tu, tv);
	    gp = MPZ_REALLOC (g, 1); /* gp = mpz_limbs_modify (g, 1); */
	    *gp = mpn_gcd_11 (tu->_mp_d[0], tv->_mp_d[0]);

	    g->_mp_size = *gp != 0; /* mpz_limbs_finish (g, 1); */
	    break;
	  }
	mpz_sub (tu, tu, tv);
      }
  mpz_clear (tu);
  mpz_clear (tv);
  mpz_mul_2exp (g, g, gz);
}